

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::prefixUnary(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  Parser *pPVar4;
  TokenID TVar5;
  mapped_type *pmVar6;
  CompileError *this_01;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  bool bVar8;
  __normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>
  __tmp;
  shared_ptr<mocker::ast::Expression> *args_1;
  shared_ptr<mocker::ast::Expression> sVar9;
  shared_ptr<mocker::ast::UnaryExpr> sVar10;
  Position beg;
  Position beg_00;
  Position end_00;
  vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_> prefix;
  shared_ptr<mocker::ast::Expression> res;
  undefined1 local_68 [32];
  Parser *local_48;
  Token *local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  local_48 = this;
  Token::position(*end._M_current);
  uVar2 = local_68._8_8_;
  local_40 = (Token *)local_68._0_8_;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar8 = true;
  do {
    this_00 = *end._M_current;
    *(Token **)end._M_current = this_00 + 1;
    if (this_00 == in_RCX) {
      TVar5 = Error;
    }
    else {
      TVar5 = Token::tokenID(this_00);
    }
    if ((int)TVar5 < 0x2b) {
      if (TVar5 != Plus) {
        if (TVar5 == Minus) {
          local_68._0_4_ = 4;
          if (prefix.
              super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              prefix.
              super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            *prefix.
             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
             ._M_impl.super__Vector_impl_data._M_finish = Neg;
            goto LAB_00181717;
          }
          std::
          vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
          _M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                    (&prefix,(iterator)
                             prefix.
                             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(OpType *)local_68);
        }
        else if (TVar5 == LogicalNot) {
          local_68._0_4_ = 5;
          if (prefix.
              super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              prefix.
              super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            *prefix.
             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
             ._M_impl.super__Vector_impl_data._M_finish = LogicalNot;
            goto LAB_00181717;
          }
          std::
          vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
          _M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                    (&prefix,(iterator)
                             prefix.
                             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(OpType *)local_68);
        }
        else {
LAB_001816d8:
          *(long *)end._M_current = *(long *)end._M_current + -0x38;
          bVar8 = false;
        }
      }
    }
    else if (TVar5 == BitNot) {
      local_68._0_4_ = 6;
      if (prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ::_M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                  (&prefix,(iterator)
                           prefix.
                           super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(OpType *)local_68);
      }
      else {
        *prefix.
         super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
         ._M_impl.super__Vector_impl_data._M_finish = BitNot;
LAB_00181717:
        prefix.
        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             prefix.
             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    else if (TVar5 == PlusPlus) {
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      if (prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        *prefix.
         super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
         ._M_impl.super__Vector_impl_data._M_finish = PreInc;
        goto LAB_00181717;
      }
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      _M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                (&prefix,(iterator)
                         prefix.
                         super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(OpType *)local_68);
    }
    else {
      if (TVar5 != MinusMinus) goto LAB_001816d8;
      local_68._0_4_ = 2;
      if (prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        *prefix.
         super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
         ._M_impl.super__Vector_impl_data._M_finish = PreDec;
        goto LAB_00181717;
      }
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      _M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                (&prefix,(iterator)
                         prefix.
                         super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(OpType *)local_68);
    }
    if (!bVar8) {
      sVar9 = suffixIncDec((Parser *)&res,iter,end);
      _Var7 = sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          this_01 = (CompileError *)__cxa_allocate_exception(0x48);
          Token::position(*end._M_current);
          beg_00.col = uVar2;
          beg_00.line = (size_t)local_40;
          CompileError::CompileError(this_01,beg_00,(Position)local_68._16_16_);
          *(undefined ***)this_01 = &PTR__CompileError_001f2a98;
          __cxa_throw(this_01,&SyntaxError::typeinfo,CompileError::~CompileError);
        }
        (local_48->tokBeg)._M_current = (Token *)0x0;
        (local_48->tokEnd)._M_current = (Token *)0x0;
      }
      else {
        if (prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          args_1 = (shared_ptr<mocker::ast::Expression> *)
                   prefix.
                   super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          do {
            local_38 = res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
            pmVar6 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)iter[2]._M_current,(key_type *)&local_38);
            args_1 = (shared_ptr<mocker::ast::Expression> *)
                     ((long)&args_1[-1].
                             super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 4);
            beg.col = (size_t)local_40;
            beg.line = (size_t)iter;
            end_00.col = (pmVar6->second).line;
            end_00.line = uVar2;
            sVar10 = makeNode<mocker::ast::UnaryExpr,mocker::ast::UnaryExpr::OpType&,std::shared_ptr<mocker::ast::Expression>&>
                               ((Parser *)local_68,beg,end_00,(OpType *)(pmVar6->second).col,args_1)
            ;
            uVar3 = local_68._8_8_;
            res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_68._0_8_;
            _Var1 = res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
            _Var7 = sVar10.super___shared_ptr<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            local_68._0_8_ = (Token *)0x0;
            local_68._8_8_ = (Token *)0x0;
            res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
            if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
              _Var7._M_pi = extraout_RDX;
            }
            if ((Token *)local_68._8_8_ != (Token *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
              _Var7._M_pi = extraout_RDX_00;
            }
          } while (args_1 != (shared_ptr<mocker::ast::Expression> *)
                             prefix.
                             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        _Var1._M_pi = res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        (local_48->tokBeg)._M_current =
             (Token *)res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
        (local_48->tokEnd)._M_current = (Token *)0x0;
        res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (local_48->tokEnd)._M_current = (Token *)_Var1._M_pi;
        res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      pPVar4 = local_48;
      if (res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var7._M_pi = extraout_RDX_01;
      }
      if (prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(prefix.
                        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)prefix.
                              super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)prefix.
                              super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        _Var7._M_pi = extraout_RDX_02;
      }
      sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var7._M_pi;
      sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pPVar4;
      return (shared_ptr<mocker::ast::Expression>)
             sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

std::shared_ptr<ast::Expression> Parser::prefixUnary(TokIter &iter,
                                                     TokIter end) {
  // ++, --, +, -, !, ~
  // prefix '+' will be ignored
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  std::vector<ast::UnaryExpr::OpType> prefix;
  bool flag = true;
  while (flag) {
    switch (id(iter++)) {
    case TokenID::PlusPlus:
      prefix.emplace_back(ast::UnaryExpr::PreInc);
      break;
    case TokenID::MinusMinus:
      prefix.emplace_back(ast::UnaryExpr::PreDec);
      break;
    case TokenID::Plus:
      break;
    case TokenID::Minus:
      prefix.emplace_back(ast::UnaryExpr::Neg);
      break;
    case TokenID::LogicalNot:
      prefix.emplace_back(ast::UnaryExpr::LogicalNot);
      break;
    case TokenID::BitNot:
      prefix.emplace_back(ast::UnaryExpr::BitNot);
      break;
    default:
      --iter;
      flag = false;
      break;
    }
  }

  auto res = suffixIncDec(iter, end);
  if (!res) {
    if (prefix.empty())
      return nullptr;
    throw SyntaxError(begPos, iter->position().second);
  }

  for (auto riter = prefix.rbegin(); riter != prefix.rend(); ++riter)
    res =
        makeNode<ast::UnaryExpr>(begPos, pos[res->getID()].second, *riter, res);

  return res;
}